

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O2

int __thiscall
xercesc_4_0::RegularExpression::matchCapture
          (RegularExpression *this,Context *context,Op *op,XMLSize_t offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = (*op->_vptr_Op[2])(op);
  if (iVar1 < 1) {
    iVar1 = -iVar1;
    iVar2 = Match::getEndPos(context->fMatch,iVar1);
    Match::setEndPos(context->fMatch,iVar1,(int)offset);
    iVar3 = match(this,context,op->fNextOp,offset);
    if (iVar3 < 0) {
      Match::setEndPos(context->fMatch,iVar1,iVar2);
    }
  }
  else {
    iVar2 = Match::getStartPos(context->fMatch,iVar1);
    Match::setStartPos(context->fMatch,iVar1,(int)offset);
    iVar3 = match(this,context,op->fNextOp,offset);
    if (iVar3 < 0) {
      Match::setStartPos(context->fMatch,iVar1,iVar2);
    }
  }
  return iVar3;
}

Assistant:

int RegularExpression::matchCapture(Context* const context, const Op* const op,
                                    XMLSize_t offset) const
{
    // No check is made for nullness of fMatch as the function is only called if
    // fMatch is not null.
    XMLInt32 index = op->getData();
    int save = (index > 0) ? context->fMatch->getStartPos(index)
                           : context->fMatch->getEndPos(-index);

    if (index > 0) {
        context->fMatch->setStartPos(index, (int)offset);
        int ret = match(context, op->getNextOp(), offset);
        if (ret < 0)
            context->fMatch->setStartPos(index, save);
        return ret;
    }

    context->fMatch->setEndPos(-index, (int)offset);
    int ret = match(context, op->getNextOp(), offset);
    if (ret < 0)
        context->fMatch->setEndPos(-index, save);
    return ret;
}